

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwWaitEventsTimeout(double timeout)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  double unaff_retaddr;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0,in_RDX,in_RAX);
    return;
  }
  if (NAN(timeout)) {
    __assert_fail("timeout == timeout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x44c,"void glfwWaitEventsTimeout(double)");
  }
  if (timeout < 0.0) {
    __assert_fail("timeout >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x44d,"void glfwWaitEventsTimeout(double)");
  }
  if (timeout <= 1.79769313486232e+308) {
    if (1.79769313486232e+308 < timeout) {
      _glfwInputError(0x10004,"Invalid time %f",in_RDX,in_RAX);
      return;
    }
    _glfwPlatformWaitEventsTimeout(unaff_retaddr);
    return;
  }
  __assert_fail("timeout <= DBL_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                ,0x44e,"void glfwWaitEventsTimeout(double)");
}

Assistant:

GLFWAPI void glfwWaitEventsTimeout(double timeout)
{
    _GLFW_REQUIRE_INIT();
    assert(timeout == timeout);
    assert(timeout >= 0.0);
    assert(timeout <= DBL_MAX);

    if (timeout != timeout || timeout < 0.0 || timeout > DBL_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid time %f", timeout);
        return;
    }

    _glfwPlatformWaitEventsTimeout(timeout);
}